

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputable.cpp
# Opt level: O1

bool snestistics::decode_static_jump
               (uint8_t opcode,RomAccessor *rom,Pointer pc,Pointer *target,Pointer *secondary_target
               )

{
  bool bVar1;
  byte bVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint16_t uVar6;
  uint uVar7;
  Pointer PVar8;
  ushort *puVar9;
  undefined7 in_register_00000039;
  
  *target = 0xffffffff;
  *secondary_target = 0xffffffff;
  if ((int)CONCAT71(in_register_00000039,opcode) == 0x82) {
    uVar6 = RomAccessor::eval16(rom,pc + 1);
    uVar7 = ((uint)(-1 < (short)uVar6) * 0x10000 + pc + uVar6) - 0xfffd;
LAB_0012c0bc:
    *target = uVar7;
  }
  else if ((&branches)[opcode] == '\x01') {
    bVar2 = RomAccessor::evalByte(rom,pc + 1);
    PVar8 = (pc - 0xfe) + (uint)bVar2;
    if (-1 < (char)bVar2) {
      PVar8 = pc + bVar2 + 2;
    }
    *target = PVar8;
    *secondary_target = pc + 2;
  }
  else {
    bVar1 = false;
    switch((opcode + 0x24) * '\x10' | (byte)(opcode + 0x24) >> 4) {
    case 0:
    case 9:
    case 10:
      break;
    default:
      goto switchD_0012c135_caseD_1;
    case 7:
      puVar9 = (ushort *)RomAccessor::evalPtr(rom,pc + 1);
      *target = pc & 0xff0000 | (uint)*puVar9;
      break;
    case 8:
      uVar3 = RomAccessor::evalByte(rom,pc + 1);
      uVar4 = RomAccessor::evalByte(rom,pc + 2);
      uVar5 = RomAccessor::evalByte(rom,pc + 3);
      uVar7 = (uint)CONCAT12(uVar5,CONCAT11(uVar4,uVar3));
      goto LAB_0012c0bc;
    }
  }
  bVar1 = true;
switchD_0012c135_caseD_1:
  return bVar1;
}

Assistant:

bool decode_static_jump(uint8_t opcode, const snestistics::RomAccessor & rom, const Pointer pc, Pointer * target, Pointer * secondary_target) {
	*target = INVALID_POINTER;
	*secondary_target = INVALID_POINTER;
	if (opcode == 0x82) { // BRL
		*target = branch16(pc, rom.eval16(pc+1));
	} else if (branches[opcode]) {
		*target = branch8(pc, rom.evalByte(pc + 1));
		if (opcode != 0x80) {
			*secondary_target = pc + 2;
		}
	} else if (opcode == 0x4C) { // Absolute jump
		Pointer p = *(uint16_t*)rom.evalPtr(pc + 1);
		p |= pc & 0xFF0000;
		*target = p;
	} else if (opcode == 0x5C) { // Absolute long jump
		Pointer p = 0;
		p |= rom.evalByte(pc + 1);
		p |= rom.evalByte(pc + 2) << 8;
		p |= rom.evalByte(pc + 3) << 16;
		*target = p;
	} else if (opcode == 0x6C || opcode == 0xDC) {
		// TODO: In this case the indirection pointer is located in bank 0 (with 16-bit address from operand)
		// Most often it will come from 7E but I guess sometimes it might actually be in bank 0... Then we could use it...
		// leave as INVALID_POINTER
	} else if (opcode == 0x7C) {
		// Indeterminate due to unknown value of X, leave as INVALID_POINTER
	}
	else {
		return false;
	}
	return true;
}